

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

int nullcGetResultInt(void)

{
  int iVar1;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (NULLC::currExec == 0) {
      iVar1 = ExecutorRegVm::GetResultInt(NULLC::executorRegVm);
      return iVar1;
    }
    if (NULLC::currExec == 1) {
      iVar1 = ExecutorX86::GetResultInt(NULLC::executorX86);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int nullcGetResultInt()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultInt();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultInt();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultInt();
#endif

	return 0;
}